

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O2

void try_convert_real<unsigned_long,int>
               (char *description,bool exp_pass,_func_int_unsigned_long_ptr *fn,unsigned_long *i)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  
  iVar1 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)fn);
  poVar2 = std::operator<<((ostream *)&std::cout,description);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<((ostream *)poVar2,iVar1);
  pcVar3 = " FAILED";
  if (exp_pass) {
    pcVar3 = " PASSED";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

static void
try_convert_real(char const* description, bool exp_pass, To (*fn)(From const&), From const& i)
{
    bool passed = false;
    try {
        To result = fn(i);
        passed = true;
        std::cout << description << ": " << i << " " << result;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}